

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

char * bson_iter_codewscope(bson_iter_t *iter,uint32_t *length,uint32_t *scope_len,uint8_t **scope)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (iter == (bson_iter_t *)0x0) {
    pcVar3 = "iter";
    uVar2 = 0x581;
LAB_0010ee81:
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,uVar2,"bson_iter_codewscope",pcVar3);
    abort();
  }
  puVar1 = iter->raw;
  if (puVar1[iter->type] == '\x0f') {
    if (length != (uint32_t *)0x0) {
      if (*(int *)(puVar1 + iter->d2) == 0) {
        pcVar3 = "len > 0";
        uVar2 = 0x588;
        goto LAB_0010ee81;
      }
      *length = *(int *)(puVar1 + iter->d2) - 1;
    }
    *scope_len = *(uint32_t *)(puVar1 + iter->d4);
    *scope = puVar1 + iter->d4;
    puVar1 = iter->raw + iter->d3;
  }
  else {
    if (length != (uint32_t *)0x0) {
      *length = 0;
    }
    if (scope_len != (uint32_t *)0x0) {
      *scope_len = 0;
    }
    if (scope != (uint8_t **)0x0) {
      *scope = (uint8_t *)0x0;
    }
    puVar1 = (uint8_t *)0x0;
  }
  return (char *)puVar1;
}

Assistant:

const char *
bson_iter_codewscope (const bson_iter_t *iter, /* IN */
                      uint32_t *length,        /* OUT */
                      uint32_t *scope_len,     /* OUT */
                      const uint8_t **scope)   /* OUT */
{
   uint32_t len;

   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_CODEWSCOPE) {
      if (length) {
         memcpy (&len, iter->raw + iter->d2, sizeof (len));
         /* The string length was checked > 0 in _bson_iter_next_internal. */
         len = BSON_UINT32_FROM_LE (len);
         BSON_ASSERT (len > 0);
         *length = len - 1;
      }

      memcpy (&len, iter->raw + iter->d4, sizeof (len));
      *scope_len = BSON_UINT32_FROM_LE (len);
      *scope = iter->raw + iter->d4;
      return (const char *) (iter->raw + iter->d3);
   }

   if (length) {
      *length = 0;
   }

   if (scope_len) {
      *scope_len = 0;
   }

   if (scope) {
      *scope = NULL;
   }

   return NULL;
}